

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O3

void av1_highbd_iwht4x4_16_add_c(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined2 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  undefined2 uVar13;
  int aiStack_68 [8];
  tran_low_t output [16];
  
  lVar3 = (long)dest8 * 2;
  lVar4 = 0;
  do {
    iVar9 = (input[lVar4] >> 2) + (input[lVar4 + 4] >> 2);
    iVar11 = (input[lVar4 + 8] >> 2) - (input[lVar4 + 0xc] >> 2);
    iVar6 = iVar9 - iVar11 >> 1;
    iVar8 = iVar6 - (input[lVar4 + 0xc] >> 2);
    iVar6 = iVar6 - (input[lVar4 + 4] >> 2);
    aiStack_68[lVar4] = iVar9 - iVar8;
    aiStack_68[lVar4 + 4] = iVar8;
    output[lVar4] = iVar6;
    output[lVar4 + 4] = iVar11 + iVar6;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 4);
  lVar4 = lVar3 + (long)stride * 2;
  lVar1 = lVar3 + (long)(stride * 2) * 2;
  lVar2 = lVar3 + (long)(stride * 3) * 2;
  lVar10 = 0;
  do {
    iVar11 = aiStack_68[lVar10 * 2] + aiStack_68[lVar10 * 2 + 1];
    iVar8 = aiStack_68[lVar10 * 2 + 2] - aiStack_68[lVar10 * 2 + 3];
    iVar9 = iVar11 - iVar8 >> 1;
    iVar6 = iVar9 - aiStack_68[lVar10 * 2 + 3];
    iVar9 = iVar9 - aiStack_68[lVar10 * 2 + 1];
    iVar8 = iVar8 + iVar9;
    uVar12 = (uint)*(ushort *)(lVar3 + lVar10) + (iVar11 - iVar6);
    uVar5 = 0;
    if (bd == 0xc) {
      uVar7 = uVar12;
      if (0xffe < uVar12) {
        uVar7 = 0xfff;
      }
      uVar13 = (short)uVar7;
      if ((int)uVar12 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar3 + lVar10) = uVar13;
      uVar7 = iVar6 + (uint)*(ushort *)(lVar4 + lVar10);
      uVar12 = uVar7;
      if (0xffe < uVar7) {
        uVar12 = 0xfff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar4 + lVar10) = uVar13;
      uVar7 = iVar9 + (uint)*(ushort *)(lVar1 + lVar10);
      uVar12 = uVar7;
      if (0xffe < uVar7) {
        uVar12 = 0xfff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar1 + lVar10) = uVar13;
      uVar7 = iVar8 + (uint)*(ushort *)(lVar2 + lVar10);
      uVar12 = uVar7;
      if (0xffe < uVar7) {
        uVar12 = 0xfff;
      }
    }
    else if (bd == 10) {
      uVar7 = uVar12;
      if (0x3fe < uVar12) {
        uVar7 = 0x3ff;
      }
      uVar13 = (short)uVar7;
      if ((int)uVar12 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar3 + lVar10) = uVar13;
      uVar7 = iVar6 + (uint)*(ushort *)(lVar4 + lVar10);
      uVar12 = uVar7;
      if (0x3fe < uVar7) {
        uVar12 = 0x3ff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar4 + lVar10) = uVar13;
      uVar7 = iVar9 + (uint)*(ushort *)(lVar1 + lVar10);
      uVar12 = uVar7;
      if (0x3fe < uVar7) {
        uVar12 = 0x3ff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar1 + lVar10) = uVar13;
      uVar7 = iVar8 + (uint)*(ushort *)(lVar2 + lVar10);
      uVar12 = uVar7;
      if (0x3fe < uVar7) {
        uVar12 = 0x3ff;
      }
    }
    else {
      uVar7 = uVar12;
      if (0xfe < uVar12) {
        uVar7 = 0xff;
      }
      uVar13 = (short)uVar7;
      if ((int)uVar12 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar3 + lVar10) = uVar13;
      uVar7 = iVar6 + (uint)*(ushort *)(lVar4 + lVar10);
      uVar12 = uVar7;
      if (0xfe < uVar7) {
        uVar12 = 0xff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar4 + lVar10) = uVar13;
      uVar7 = iVar9 + (uint)*(ushort *)(lVar1 + lVar10);
      uVar12 = uVar7;
      if (0xfe < uVar7) {
        uVar12 = 0xff;
      }
      uVar13 = (short)uVar12;
      if ((int)uVar7 < 0) {
        uVar13 = uVar5;
      }
      *(undefined2 *)(lVar1 + lVar10) = uVar13;
      uVar7 = iVar8 + (uint)*(ushort *)(lVar2 + lVar10);
      uVar12 = uVar7;
      if (0xfe < uVar7) {
        uVar12 = 0xff;
      }
    }
    uVar13 = (short)uVar12;
    if ((int)uVar7 < 0) {
      uVar13 = uVar5;
    }
    *(undefined2 *)(lVar2 + lVar10) = uVar13;
    lVar10 = lVar10 + 2;
  } while ((int)lVar10 != 8);
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_c(const tran_low_t *input, uint8_t *dest8,
                                 int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  int i;
  tran_low_t output[16];
  tran_low_t a1, b1, c1, d1, e1;
  const tran_low_t *ip = input;
  tran_low_t *op = output;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0] >> UNIT_QUANT_SHIFT;
    c1 = ip[4 * 1] >> UNIT_QUANT_SHIFT;
    d1 = ip[4 * 2] >> UNIT_QUANT_SHIFT;
    b1 = ip[4 * 3] >> UNIT_QUANT_SHIFT;
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    op[4 * 0] = a1;
    op[4 * 1] = b1;
    op[4 * 2] = c1;
    op[4 * 3] = d1;
    ip++;
    op++;
  }

  ip = output;
  for (i = 0; i < 4; i++) {
    a1 = ip[0];
    c1 = ip[1];
    d1 = ip[2];
    b1 = ip[3];
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    range_check_value(a1, bd + 1);
    range_check_value(b1, bd + 1);
    range_check_value(c1, bd + 1);
    range_check_value(d1, bd + 1);

    dest[stride * 0] = highbd_clip_pixel_add(dest[stride * 0], a1, bd);
    dest[stride * 1] = highbd_clip_pixel_add(dest[stride * 1], b1, bd);
    dest[stride * 2] = highbd_clip_pixel_add(dest[stride * 2], c1, bd);
    dest[stride * 3] = highbd_clip_pixel_add(dest[stride * 3], d1, bd);

    ip += 4;
    dest++;
  }
}